

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O2

void strip_crlf(char *str)

{
  size_t sVar1;
  char *pcVar2;
  
  sVar1 = strlen(str);
  pcVar2 = str + sVar1;
  while ((str < pcVar2 && ((pcVar2[-1] == '\r' || (pcVar2[-1] == '\n'))))) {
    pcVar2 = pcVar2 + -1;
    *pcVar2 = '\0';
  }
  return;
}

Assistant:

void strip_crlf(char *str)
{
    char *p = str + strlen(str);

    while (p > str && (p[-1] == '\r' || p[-1] == '\n'))
        *--p = '\0';
}